

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm2js.h
# Opt level: O2

Ref __thiscall
wasm::Wasm2JSBuilder::processExpression(wasm::Expression*,wasm::Module*,wasm::Function*,bool)::
ExpressionProcessor::visitSelect(wasm::Select__(void *this,Select *curr)

{
  bool bVar1;
  Ref RVar2;
  Ref RVar3;
  Ref RVar4;
  Ref RVar5;
  Ref RVar6;
  Ref ifFalse;
  IString possible;
  IString possible_00;
  IString possible_01;
  IString nextResult;
  IString nextResult_00;
  IString nextResult_01;
  IString op;
  IString op_00;
  IString op_01;
  IString nextResult_02;
  IString nextResult_03;
  IString nextResult_04;
  undefined1 local_4d0 [8];
  EffectAnalyzer conditionEffects;
  EffectAnalyzer ifTrueEffects;
  EffectAnalyzer ifFalseEffects;
  ScopedTemp tempIfTrue;
  ScopedTemp tempIfFalse;
  ScopedTemp tempCondition;
  
  EffectAnalyzer::EffectAnalyzer
            ((EffectAnalyzer *)local_4d0,(PassOptions *)(*this + 0x60),
             *(Module **)((long)this + 0x20),*(Expression **)(curr + 0x20));
  EffectAnalyzer::EffectAnalyzer
            ((EffectAnalyzer *)
             &conditionEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_node_count,
             (PassOptions *)(*this + 0x60),*(Module **)((long)this + 0x20),
             *(Expression **)(curr + 0x10));
  EffectAnalyzer::EffectAnalyzer
            ((EffectAnalyzer *)
             &ifTrueEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_node_count,
             (PassOptions *)(*this + 0x60),*(Module **)((long)this + 0x20),
             *(Expression **)(curr + 0x18));
  bVar1 = EffectAnalyzer::invalidates
                    ((EffectAnalyzer *)local_4d0,
                     (EffectAnalyzer *)
                     &conditionEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header.
                      _M_node_count);
  if (!bVar1) {
    bVar1 = EffectAnalyzer::invalidates
                      ((EffectAnalyzer *)local_4d0,
                       (EffectAnalyzer *)
                       &ifTrueEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header.
                        _M_node_count);
    if (!bVar1) {
      bVar1 = EffectAnalyzer::hasSideEffects
                        ((EffectAnalyzer *)
                         &conditionEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header.
                          _M_node_count);
      if (!bVar1) {
        bVar1 = EffectAnalyzer::hasSideEffects
                          ((EffectAnalyzer *)
                           &ifTrueEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header.
                            _M_node_count);
        if (!bVar1) {
          nextResult_02.str._M_str = cashew::RSHIFT;
          nextResult_02.str._M_len = EXPRESSION_RESULT;
          RVar6 = visit(wasm::Expression*,wasm::IString_
                            (this,*(Expression **)(curr + 0x20),nextResult_02);
          nextResult_03.str._M_str = cashew::RSHIFT;
          nextResult_03.str._M_len = EXPRESSION_RESULT;
          RVar2 = visit(wasm::Expression*,wasm::IString_
                            (this,*(Expression **)(curr + 0x10),nextResult_03);
          nextResult_04.str._M_str = cashew::RSHIFT;
          nextResult_04.str._M_len = EXPRESSION_RESULT;
          RVar3 = visit(wasm::Expression*,wasm::IString_
                            (this,*(Expression **)(curr + 0x18),nextResult_04);
          RVar6 = cashew::ValueBuilder::makeConditional(RVar6,RVar2,RVar3);
          goto LAB_001549d0;
        }
      }
    }
  }
  possible.str._M_str = _finalize;
  possible.str._M_len = (size_t)NO_RESULT;
  ScopedTemp::ScopedTemp(wasm::Type,wasm::Wasm2JSBuilder*,wasm::Function*,wasm::IString_
            (&ifFalseEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_node_count,
             (Type)*(uintptr_t *)(curr + 8),*this,*(Function **)((long)this + 0x18),possible);
  possible_00.str._M_str = _finalize;
  possible_00.str._M_len = (size_t)NO_RESULT;
  ScopedTemp::ScopedTemp(wasm::Type,wasm::Wasm2JSBuilder*,wasm::Function*,wasm::IString_
            (&tempIfTrue.needFree,(Type)*(uintptr_t *)(curr + 8),*this,
             *(Function **)((long)this + 0x18),possible_00);
  possible_01.str._M_str = _finalize;
  possible_01.str._M_len = (size_t)NO_RESULT;
  RVar6.inst = NO_RESULT;
  ScopedTemp::ScopedTemp(wasm::Type,wasm::Wasm2JSBuilder*,wasm::Function*,wasm::IString_
            (&tempIfFalse.needFree,(Type)0x2,*this,*(Function **)((long)this + 0x18),possible_01);
  nextResult.str._M_str = cashew::RSHIFT;
  nextResult.str._M_len = EXPRESSION_RESULT;
  RVar2 = visit(wasm::Expression*,wasm::IString_(this,*(Expression **)(curr + 0x10),nextResult);
  nextResult_00.str._M_str = cashew::RSHIFT;
  nextResult_00.str._M_len = EXPRESSION_RESULT;
  RVar3 = visit(wasm::Expression*,wasm::IString_(this,*(Expression **)(curr + 0x18),nextResult_00);
  nextResult_01.str._M_str = cashew::RSHIFT;
  nextResult_01.str._M_len = EXPRESSION_RESULT;
  RVar4 = visit(wasm::Expression*,wasm::IString_(this,*(Expression **)(curr + 0x20),nextResult_01);
  RVar5 = processExpression::ExpressionProcessor::ScopedTemp::getAstName
                    ((ScopedTemp *)
                     &ifFalseEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header.
                      _M_node_count);
  op.str._M_str = (char *)RVar2.inst;
  op.str._M_len = BLOCK;
  RVar2 = cashew::ValueBuilder::makeBinary(RVar5.inst,cashew::SET,op,RVar6);
  RVar5 = processExpression::ExpressionProcessor::ScopedTemp::getAstName
                    ((ScopedTemp *)&tempIfTrue.needFree);
  op_00.str._M_str = (char *)RVar3.inst;
  op_00.str._M_len = BLOCK;
  RVar3 = cashew::ValueBuilder::makeBinary(RVar5.inst,cashew::SET,op_00,RVar6);
  RVar5 = processExpression::ExpressionProcessor::ScopedTemp::getAstName
                    ((ScopedTemp *)&tempIfFalse.needFree);
  op_01.str._M_str = (char *)RVar4.inst;
  op_01.str._M_len = BLOCK;
  RVar6 = cashew::ValueBuilder::makeBinary(RVar5.inst,cashew::SET,op_01,RVar6);
  RVar4 = processExpression::ExpressionProcessor::ScopedTemp::getAstName
                    ((ScopedTemp *)&tempIfFalse.needFree);
  RVar5 = processExpression::ExpressionProcessor::ScopedTemp::getAstName
                    ((ScopedTemp *)
                     &ifFalseEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header.
                      _M_node_count);
  ifFalse = processExpression::ExpressionProcessor::ScopedTemp::getAstName
                      ((ScopedTemp *)&tempIfTrue.needFree);
  RVar4 = cashew::ValueBuilder::makeConditional(RVar4,RVar5,ifFalse);
  RVar6 = cashew::ValueBuilder::makeSeq(RVar6,RVar4);
  RVar6 = cashew::ValueBuilder::makeSeq(RVar3,RVar6);
  RVar6 = cashew::ValueBuilder::makeSeq(RVar2,RVar6);
  processExpression::ExpressionProcessor::ScopedTemp::~ScopedTemp
            ((ScopedTemp *)&tempIfFalse.needFree);
  processExpression::ExpressionProcessor::ScopedTemp::~ScopedTemp
            ((ScopedTemp *)&tempIfTrue.needFree);
  processExpression::ExpressionProcessor::ScopedTemp::~ScopedTemp
            ((ScopedTemp *)
             &ifFalseEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_node_count);
LAB_001549d0:
  EffectAnalyzer::~EffectAnalyzer
            ((EffectAnalyzer *)
             &ifTrueEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_node_count);
  EffectAnalyzer::~EffectAnalyzer
            ((EffectAnalyzer *)
             &conditionEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_node_count);
  EffectAnalyzer::~EffectAnalyzer((EffectAnalyzer *)local_4d0);
  return (Ref)RVar6.inst;
}

Assistant:

Ref visitSelect(Select* curr) {
      // If the condition has effects that interact with the operands, we must
      // reorder it to the start. We must also use locals if the values have
      // side effects, as a JS conditional does not visit both sides.
      bool useLocals = false;
      EffectAnalyzer conditionEffects(
        parent->options, *module, curr->condition);
      EffectAnalyzer ifTrueEffects(parent->options, *module, curr->ifTrue);
      EffectAnalyzer ifFalseEffects(parent->options, *module, curr->ifFalse);
      if (conditionEffects.invalidates(ifTrueEffects) ||
          conditionEffects.invalidates(ifFalseEffects) ||
          ifTrueEffects.hasSideEffects() || ifFalseEffects.hasSideEffects()) {
        useLocals = true;
      }
      if (useLocals) {
        ScopedTemp tempIfTrue(curr->type, parent, func),
          tempIfFalse(curr->type, parent, func),
          tempCondition(Type::i32, parent, func);
        Ref ifTrue = visit(curr->ifTrue, EXPRESSION_RESULT);
        Ref ifFalse = visit(curr->ifFalse, EXPRESSION_RESULT);
        Ref condition = visit(curr->condition, EXPRESSION_RESULT);
        return ValueBuilder::makeSeq(
          ValueBuilder::makeBinary(tempIfTrue.getAstName(), SET, ifTrue),
          ValueBuilder::makeSeq(
            ValueBuilder::makeBinary(tempIfFalse.getAstName(), SET, ifFalse),
            ValueBuilder::makeSeq(
              ValueBuilder::makeBinary(
                tempCondition.getAstName(), SET, condition),
              ValueBuilder::makeConditional(tempCondition.getAstName(),
                                            tempIfTrue.getAstName(),
                                            tempIfFalse.getAstName()))));
      } else {
        // Simple case without reordering.
        return ValueBuilder::makeConditional(
          visit(curr->condition, EXPRESSION_RESULT),
          visit(curr->ifTrue, EXPRESSION_RESULT),
          visit(curr->ifFalse, EXPRESSION_RESULT));
      }
    }